

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedStrings::_InternalSerialize
          (TensorValue_RepeatedStrings *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  void *data;
  Type *s;
  ulong uVar1;
  uint8_t *puVar2;
  int iVar3;
  int index;
  size_t sVar4;
  
  iVar3 = (this->values_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar3) {
    index = 0;
    do {
      s = google::protobuf::internal::RepeatedPtrFieldBase::
          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                    (&(this->values_).super_RepeatedPtrFieldBase,index);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((s->_M_dataplus)._M_p,(int)s->_M_string_length,SERIALIZE,
                 "CoreML.Specification.MILSpec.TensorValue.RepeatedStrings.values");
      sVar4 = s->_M_string_length;
      if (((long)sVar4 < 0x80) && ((long)sVar4 <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = '\n';
        target[1] = (uint8_t)sVar4;
        memcpy(target + 2,(s->_M_dataplus)._M_p,sVar4);
        target = target + sVar4 + 2;
      }
      else {
        target = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline(stream,1,s,target);
      }
      index = index + 1;
    } while (iVar3 != index);
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = uVar1 & 0xfffffffffffffffc;
    data = *(void **)(uVar1 + 8);
    iVar3 = (int)*(undefined8 *)(uVar1 + 0x10);
    sVar4 = (size_t)iVar3;
    if ((long)stream->end_ - (long)target < (long)sVar4) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,iVar3,target)
      ;
      return puVar2;
    }
    memcpy(target,data,sVar4);
    target = target + sVar4;
  }
  return target;
}

Assistant:

uint8_t* TensorValue_RepeatedStrings::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.MILSpec.TensorValue.RepeatedStrings)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string values = 1;
  for (int i = 0, n = this->_internal_values_size(); i < n; i++) {
    const auto& s = this->_internal_values(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.MILSpec.TensorValue.RepeatedStrings.values");
    target = stream->WriteString(1, s, target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.MILSpec.TensorValue.RepeatedStrings)
  return target;
}